

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdp.cpp
# Opt level: O0

ScenarioLowerBound * __thiscall
despot::DSPOMDP::CreateScenarioLowerBound(DSPOMDP *this,string *name,string *particle_bound_name)

{
  bool bVar1;
  int iVar2;
  TrivialParticleLowerBound *this_00;
  RandomPolicy *this_01;
  undefined4 extraout_var;
  ostream *poVar3;
  string local_58 [48];
  string *local_28;
  string *particle_bound_name_local;
  string *name_local;
  DSPOMDP *this_local;
  
  local_28 = particle_bound_name;
  particle_bound_name_local = name;
  name_local = (string *)this;
  bVar1 = std::operator==(name,"TRIVIAL");
  if ((bVar1) || (bVar1 = std::operator==(name,"DEFAULT"), bVar1)) {
    this_00 = (TrivialParticleLowerBound *)operator_new(0x10);
    TrivialParticleLowerBound::TrivialParticleLowerBound(this_00,this);
    this_local = (DSPOMDP *)this_00;
  }
  else {
    bVar1 = std::operator==(name,"RANDOM");
    if (!bVar1) {
      bVar1 = std::operator!=(name,"print");
      if (bVar1) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Unsupported lower bound: ");
        poVar3 = std::operator<<(poVar3,(string *)name);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      poVar3 = std::operator<<((ostream *)&std::cerr,"Supported types: TRIVIAL (default)");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    this_01 = (RandomPolicy *)operator_new(0x38);
    std::__cxx11::string::string(local_58,(string *)particle_bound_name);
    iVar2 = (*this->_vptr_DSPOMDP[0xe])(this,local_58);
    RandomPolicy::RandomPolicy(this_01,this,(ParticleLowerBound *)CONCAT44(extraout_var,iVar2));
    this_local = (DSPOMDP *)this_01;
    std::__cxx11::string::~string(local_58);
  }
  return (ScenarioLowerBound *)this_local;
}

Assistant:

ScenarioLowerBound* DSPOMDP::CreateScenarioLowerBound(string name,
		string particle_bound_name) const {
	if (name == "TRIVIAL" || name == "DEFAULT") {
		return new TrivialParticleLowerBound(this);
	} else if (name == "RANDOM") {
		return new RandomPolicy(this,
				CreateParticleLowerBound(particle_bound_name));
	} else {
		if (name != "print")
			cerr << "Unsupported lower bound: " << name << endl;
		cerr << "Supported types: TRIVIAL (default)" << endl;
		exit(1);
		return NULL;
	}
}